

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O2

vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *
parse_device_list(vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                  *__return_storage_ptr__,string *value)

{
  bool bVar1;
  int iVar2;
  invalid_argument *piVar3;
  pointer pbVar4;
  pointer pbVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dev_names;
  ggml_backend_device *dev;
  string local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  string_split<std::__cxx11::string>(&dev_names,value,',');
  if (dev_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      dev_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"no devices specified");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pbVar4 = dev_names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar5 = dev_names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((long)dev_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)dev_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start == 0x20) &&
     (bVar1 = std::operator==(dev_names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,"none"),
     pbVar4 = dev_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,
     pbVar5 = dev_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start, bVar1)) {
    local_48._M_dataplus._M_p = (pointer)0x0;
    std::vector<ggml_backend_device*,std::allocator<ggml_backend_device*>>::
    emplace_back<ggml_backend_device*>
              ((vector<ggml_backend_device*,std::allocator<ggml_backend_device*>> *)
               __return_storage_ptr__,(ggml_backend_device **)&local_48);
  }
  else {
    for (; pbVar5 != pbVar4; pbVar5 = pbVar5 + 1) {
      dev = (ggml_backend_device *)ggml_backend_dev_by_name((pbVar5->_M_dataplus)._M_p);
      if ((dev == (ggml_backend_device *)0x0) || (iVar2 = ggml_backend_dev_type(dev), iVar2 != 1)) {
        piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
        string_format_abi_cxx11_(&local_48,"invalid device: %s",(pbVar5->_M_dataplus)._M_p);
        std::invalid_argument::invalid_argument(piVar3,(string *)&local_48);
        __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::push_back
                (__return_storage_ptr__,&dev);
    }
    local_48._M_dataplus._M_p = (pointer)0x0;
    std::vector<ggml_backend_device*,std::allocator<ggml_backend_device*>>::
    emplace_back<ggml_backend_device*>
              ((vector<ggml_backend_device*,std::allocator<ggml_backend_device*>> *)
               __return_storage_ptr__,(ggml_backend_device **)&local_48);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&dev_names);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<ggml_backend_dev_t> parse_device_list(const std::string & value) {
    std::vector<ggml_backend_dev_t> devices;
    auto dev_names = string_split<std::string>(value, ',');
    if (dev_names.empty()) {
        throw std::invalid_argument("no devices specified");
    }
    if (dev_names.size() == 1 && dev_names[0] == "none") {
        devices.push_back(nullptr);
    } else {
        for (const auto & device : dev_names) {
            auto * dev = ggml_backend_dev_by_name(device.c_str());
            if (!dev || ggml_backend_dev_type(dev) != GGML_BACKEND_DEVICE_TYPE_GPU) {
                throw std::invalid_argument(string_format("invalid device: %s", device.c_str()));
            }
            devices.push_back(dev);
        }
        devices.push_back(nullptr);
    }
    return devices;
}